

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

uint __thiscall llvm::APInt::countTrailingOnesSlowCase(APInt *this)

{
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  uint local_18;
  uint local_14;
  uint i;
  uint Count;
  APInt *this_local;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    uVar1 = getNumWords(this);
    bVar3 = false;
    if (local_18 < uVar1) {
      bVar3 = (this->U).pVal[local_18] == 0xffffffffffffffff;
    }
    if (!bVar3) break;
    local_14 = local_14 + 0x40;
    local_18 = local_18 + 1;
  }
  uVar1 = getNumWords(this);
  if (local_18 < uVar1) {
    sVar2 = countTrailingOnes<unsigned_long>((this->U).pVal[local_18],ZB_Width);
    local_14 = local_14 + (int)sVar2;
  }
  if (local_14 <= this->BitWidth) {
    return local_14;
  }
  __assert_fail("Count <= BitWidth",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x24d,"unsigned int llvm::APInt::countTrailingOnesSlowCase() const");
}

Assistant:

unsigned APInt::countTrailingOnesSlowCase() const {
  unsigned Count = 0;
  unsigned i = 0;
  for (; i < getNumWords() && U.pVal[i] == WORD_MAX; ++i)
    Count += APINT_BITS_PER_WORD;
  if (i < getNumWords())
    Count += llvm::countTrailingOnes(U.pVal[i]);
  assert(Count <= BitWidth);
  return Count;
}